

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmsdemo.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  int iVar1;
  FILE *__stream;
  FILE *__stream_00;
  int i;
  int iVar2;
  double input;
  double dVar3;
  double error;
  double input_signal;
  Fir1 fir;
  
  Fir1::Fir1(&fir,100,0.0);
  fir.mu = 0.0005;
  __stream = fopen("ecg50hz.dat","rt");
  __stream_00 = fopen("ecg_filtered.dat","wt");
  iVar2 = 0;
  while( true ) {
    iVar1 = __isoc99_fscanf(__stream,"%lf\n",&input_signal);
    if (iVar1 < 1) break;
    input = sin((double)iVar2 * 0.3141592653589793);
    dVar3 = Fir1::filter(&fir,input);
    error = input_signal - dVar3;
    Fir1::lms_update(&fir,error);
    fprintf(__stream_00,"%f %f %f\n",error,dVar3,input);
    iVar2 = iVar2 + 1;
  }
  fclose(__stream);
  fclose(__stream_00);
  fwrite("Written the filtered ECG to \'ecg_filtered.dat\'\n",0x2f,1,_stderr);
  Fir1::~Fir1(&fir);
  return 0;
}

Assistant:

int main (int,char**)
{
	// inits the filter
	Fir1 fir(NTAPS);
	fir.setLearningRate(LEARNING_RATE);

	FILE *finput = fopen("ecg50hz.dat","rt");
	FILE *foutput = fopen("ecg_filtered.dat","wt");
	for(int i=0;;i++) 
	{
		double input_signal;		
		if (fscanf(finput,"%lf\n",&input_signal)<1) break;
		double ref_noise = sin(2*M_PI/20*i);
		double canceller = fir.filter(ref_noise);
		double output_signal = input_signal - canceller;
		fir.lms_update(output_signal);
		fprintf(foutput,"%f %f %f\n",output_signal,canceller,ref_noise);
	}
	fclose(finput);
	fclose(foutput);
	fprintf(stderr,"Written the filtered ECG to 'ecg_filtered.dat'\n");
}